

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O1

bool __thiscall Func::DoLoopFastPaths(Func *this)

{
  ExecutionMode EVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  JITTimeFunctionBody *pJVar5;
  FunctionJITTimeInfo *pFVar6;
  
  EVar1 = JITTimeWorkItem::GetJitMode(this->m_workItem);
  if ((EVar1 != SimpleJit) || (DAT_015bbe4c == '\x01')) {
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar5);
    pFVar6 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar6);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,FastPathPhase,uVar3,uVar4);
    if (!bVar2) {
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
      uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar5);
      pFVar6 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
      uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar6);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,LoopFastPathPhase,uVar3,uVar4);
      return !bVar2;
    }
  }
  return false;
}

Assistant:

bool DoLoopFastPaths() const
    {
        return
            (!IsSimpleJit() || CONFIG_FLAG(NewSimpleJit)) &&
            !PHASE_OFF(Js::FastPathPhase, this) &&
            !PHASE_OFF(Js::LoopFastPathPhase, this);
    }